

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall cmCPackDebGenerator::InitializeInternal(cmCPackDebGenerator *this)

{
  bool bVar1;
  int iVar2;
  char *val;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  cmCPackDebGenerator *local_10;
  cmCPackDebGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CPACK_PACKAGING_INSTALL_PREFIX",&local_31);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"/usr");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CPACK_SET_DESTDIR",&local_69);
  val = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
  bVar1 = cmSystemTools::IsOff(val);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CPACK_SET_DESTDIR",&local_91);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_90,"I_ON");
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackDebGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (cmSystemTools::IsOff(this->GetOption("CPACK_SET_DESTDIR")))
    {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
    }
  return this->Superclass::InitializeInternal();
}